

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O2

void __thiscall
t_ocaml_generator::generate_ocaml_struct_writer
          (t_ocaml_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_field *tmember;
  t_ocaml_generator *os;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  pointer pptVar5;
  char *pcVar6;
  t_ocaml_generator *ptVar7;
  string _v;
  string mname;
  string f;
  string name;
  string str;
  string local_188;
  t_ocaml_generator *local_168;
  t_struct *local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  pointer local_118;
  undefined1 local_110 [32];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90 [32];
  string local_70;
  string local_50;
  
  local_160 = tstruct;
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  std::__cxx11::string::string((string *)(local_110 + 0x80),(string *)CONCAT44(extraout_var,iVar3));
  std::__cxx11::string::string((string *)(local_110 + 0x60),"_str",(allocator *)(local_110 + 0x40));
  t_generator::tmp(&local_50,(t_generator *)this,(string *)(local_110 + 0x60));
  std::__cxx11::string::~string((string *)(local_110 + 0x60));
  std::__cxx11::string::string((string *)(local_110 + 0x20),"_f",(allocator *)&local_158);
  t_generator::tmp((string *)(local_110 + 0x40),(t_generator *)this,(string *)(local_110 + 0x20));
  std::__cxx11::string::~string((string *)(local_110 + 0x20));
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"method write (oprot : Protocol.t) =");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  poVar4 = t_generator::indent((t_generator *)this,out);
  poVar4 = std::operator<<(poVar4,"oprot#writeStructBegin \"");
  poVar4 = std::operator<<(poVar4,(string *)(local_110 + 0x80));
  poVar4 = std::operator<<(poVar4,"\";");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  pptVar5 = (local_160->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_168 = (t_ocaml_generator *)out;
  do {
    if (pptVar5 ==
        (local_160->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
      poVar4 = std::operator<<((ostream *)local_168,(string *)&local_158);
      poVar4 = std::operator<<(poVar4,"oprot#writeFieldStop;");
      poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_188,(t_generator *)this);
      poVar4 = std::operator<<(poVar4,(string *)&local_188);
      poVar4 = std::operator<<(poVar4,"oprot#writeStructEnd");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_158);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      std::__cxx11::string::~string((string *)(local_110 + 0x40));
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)(local_110 + 0x80));
      return;
    }
    tmember = *pptVar5;
    local_118 = pptVar5;
    std::__cxx11::string::string((string *)local_110,(string *)&tmember->name_);
    t_generator::decapitalize(&local_188,(t_generator *)this,(string *)local_110);
    std::operator+(&local_158,"_",&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    ptVar7 = (t_ocaml_generator *)local_110;
    std::__cxx11::string::~string((string *)ptVar7);
    os = local_168;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    local_188._M_string_length = 0;
    local_188.field_2._M_local_buf[0] = '\0';
    if (tmember->value_ == (t_const_value *)0x0) {
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)local_168);
      poVar4 = std::operator<<(poVar4,"(match ");
      poVar4 = std::operator<<(poVar4,(string *)&local_158);
      std::operator<<(poVar4," with ");
      if (tmember->req_ == T_REQUIRED) {
        std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
        poVar4 = std::operator<<(poVar4,"| None -> raise (Field_empty \"");
        type_name_abi_cxx11_(&local_138,this,&local_160->super_t_type);
        poVar4 = std::operator<<(poVar4,(string *)&local_138);
        poVar4 = std::operator<<(poVar4,".");
        poVar4 = std::operator<<(poVar4,(string *)&local_158);
        poVar4 = std::operator<<(poVar4,"\")");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_138);
        ptVar7 = (t_ocaml_generator *)t_generator::indent((t_generator *)this,(ostream *)os);
        pcVar6 = "| Some _v -> ";
      }
      else {
        ptVar7 = os;
        std::operator<<((ostream *)os,"None -> ()");
        bVar2 = struct_member_default_cheaply_comparable(ptVar7,tmember);
        pcVar6 = " | Some _v -> ";
        ptVar7 = os;
        if (bVar2) {
          poVar4 = std::operator<<((ostream *)os," | Some ");
          render_const_value_abi_cxx11_(&local_138,this,tmember->type_,tmember->value_);
          poVar4 = std::operator<<(poVar4,(string *)&local_138);
          std::operator<<(poVar4," -> ()");
          std::__cxx11::string::~string((string *)&local_138);
          pcVar6 = " | Some _v -> ";
        }
      }
      poVar4 = std::operator<<((ostream *)ptVar7,pcVar6);
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::assign((char *)&local_188);
    }
    else {
      if (tmember->req_ != T_REQUIRED) {
        bVar2 = struct_member_default_cheaply_comparable(ptVar7,tmember);
        if (bVar2) {
          std::__cxx11::string::assign((char *)&local_188);
          poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
          poVar4 = std::operator<<(poVar4,"(match ");
          poVar4 = std::operator<<(poVar4,(string *)&local_158);
          poVar4 = std::operator<<(poVar4," with ");
          render_const_value_abi_cxx11_(&local_138,this,tmember->type_,tmember->value_);
          poVar4 = std::operator<<(poVar4,(string *)&local_138);
          poVar4 = std::operator<<(poVar4," -> () | ");
          poVar4 = std::operator<<(poVar4,(string *)&local_188);
          poVar4 = std::operator<<(poVar4," -> ");
          std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_138);
          goto LAB_0025f2dd;
        }
      }
      std::__cxx11::string::_M_assign((string *)&local_188);
      poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
      poVar4 = std::operator<<(poVar4,"(");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
LAB_0025f2dd:
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"oprot#writeFieldBegin(\"");
    poVar4 = std::operator<<(poVar4,(string *)&tmember->name_);
    ptVar7 = (t_ocaml_generator *)0x2cf471;
    poVar4 = std::operator<<(poVar4,"\",");
    type_to_enum_abi_cxx11_(&local_138,ptVar7,tmember->type_);
    poVar4 = std::operator<<(poVar4,(string *)&local_138);
    poVar4 = std::operator<<(poVar4,",");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,tmember->key_);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::string((string *)&local_70,(string *)&local_188);
    generate_serialize_field(this,(ostream *)os,tmember,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,"oprot#writeFieldEnd");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)os);
    poVar4 = std::operator<<(poVar4,");");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_158);
    pptVar5 = local_118 + 1;
  } while( true );
}

Assistant:

void t_ocaml_generator::generate_ocaml_struct_writer(ostream& out, t_struct* tstruct) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;
  string str = tmp("_str");
  string f = tmp("_f");

  indent(out) << "method write (oprot : Protocol.t) =" << endl;
  indent_up();
  indent(out) << "oprot#writeStructBegin \"" << name << "\";" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    t_field* tmember = (*f_iter);
    string mname = "_" + decapitalize(tmember->get_name());
    string _v;

    if (struct_member_persistent(tmember)) {

      if (struct_member_omitable(tmember) && struct_member_default_cheaply_comparable(tmember)) {
        _v = "_v";
        // Avoid redundant encoding of members having default values.
        indent(out) << "(match " << mname << " with "
                    << render_const_value(tmember->get_type(), tmember->get_value()) << " -> () | "
                    << _v << " -> " << endl;
      } else {
        _v = mname;
        indent(out) << "(" << endl;
      }

    } else {

      indent(out) << "(match " << mname << " with ";

      if (struct_member_omitable(tmember)) {
        out << "None -> ()";

        if (struct_member_default_cheaply_comparable(tmember)) {
          // Avoid redundant encoding of members having default values.
          out << " | Some " << render_const_value(tmember->get_type(), tmember->get_value())
              << " -> ()";
        }
        out << " | Some _v -> " << endl;
      } else {
        out << endl;
        indent(out) << "| None -> raise (Field_empty \"" << type_name(tstruct) << "." << mname
                    << "\")" << endl;
        indent(out) << "| Some _v -> " << endl;
      }

      _v = "_v";
    }
    indent_up();
    // Write field header
    indent(out) << "oprot#writeFieldBegin(\"" << tmember->get_name() << "\","
                << type_to_enum(tmember->get_type()) << "," << tmember->get_key() << ");" << endl;

    // Write field contents
    generate_serialize_field(out, tmember, _v);

    // Write field closer
    indent(out) << "oprot#writeFieldEnd" << endl;

    indent_down();
    indent(out) << ");" << endl;
  }

  // Write the struct map
  out << indent() << "oprot#writeFieldStop;" << endl << indent() << "oprot#writeStructEnd" << endl;

  indent_down();
}